

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

uint cmdline::detail::
     lexical_cast_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
     ::cast(string *arg)

{
  istream *piVar1;
  undefined8 *puVar2;
  uint ret;
  istringstream ss;
  byte abStack_168 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)arg,_S_in);
  piVar1 = std::istream::_M_extract<unsigned_int>((uint *)&ss);
  if ((((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) &&
     ((abStack_168[*(long *)(_ss + -0x18)] & 2) != 0)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return ret;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = __cxa_guard_abort;
  __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static Target cast(const std::string &arg){
    Target ret;
    std::istringstream ss(arg);
    if (!(ss>>ret && ss.eof()))
      throw std::bad_cast();
    return ret;
  }